

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 StreamRead(io_private *pDev,void *pBuf,jx9_int64 nLen)

{
  jx9_io_stream *pjVar1;
  jx9_int64 jVar2;
  jx9_int64 nRead;
  jx9_int64 n;
  char *zBuf;
  jx9_io_stream *pStream;
  jx9_int64 nLen_local;
  void *pBuf_local;
  io_private *pDev_local;
  
  pjVar1 = pDev->pStream;
  nRead = (jx9_int64)((pDev->sBuffer).nByte - pDev->nOfft);
  n = (jx9_int64)pBuf;
  pStream = (jx9_io_stream *)nLen;
  if (nRead != 0) {
    if (nLen < nRead) {
      nRead = nLen;
    }
    SyMemcpy((void *)((long)(pDev->sBuffer).pBlob + (ulong)pDev->nOfft),pBuf,(sxu32)nRead);
    pDev->nOfft = (sxu32)nRead + pDev->nOfft;
    if ((pDev->sBuffer).nByte <= pDev->nOfft) {
      SyBlobReset(&pDev->sBuffer);
      pDev->nOfft = 0;
    }
    pStream = (jx9_io_stream *)(nLen - nRead);
    if ((long)pStream < 1) {
      return nRead;
    }
    n = nRead + (long)pBuf;
  }
  jVar2 = (*pjVar1->xRead)(pDev->pHandle,(void *)n,(jx9_int64)pStream);
  if (jVar2 < 1) {
    if (nRead < 1) {
      return jVar2;
    }
  }
  else {
    nRead = jVar2 + nRead;
  }
  return nRead;
}

Assistant:

static jx9_int64 StreamRead(io_private *pDev, void *pBuf, jx9_int64 nLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char *zBuf = (char *)pBuf;
	jx9_int64 n, nRead;
	n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
	if( n > 0 ){
		if( n > nLen ){
			n = nLen;
		}
		/* Copy the buffered data */
		SyMemcpy(SyBlobDataAt(&pDev->sBuffer, pDev->nOfft), pBuf, (sxu32)n);
		/* Update the read offset */
		pDev->nOfft += (sxu32)n;
		if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
			/* Reset the working buffer so that we avoid excessive memory allocation */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
		}
		nLen -= n;
		if( nLen < 1 ){
			/* All done */
			return n;
		}
		/* Advance the cursor */
		zBuf += n;
	}
	/* Read without buffering */
	nRead = pStream->xRead(pDev->pHandle, zBuf, nLen);
	if( nRead > 0 ){
		n += nRead;
	}else if( n < 1 ){
		/* EOF or IO error */
		return nRead;
	}
	return n;
}